

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O3

void * Memalign(size_t align,size_t size)

{
  void *local_20;
  
  local_20 = (void *)size;
  (*noopt_helper)(&local_20);
  local_20 = (void *)memalign(align,local_20);
  (*noopt_helper)(&local_20);
  return local_20;
}

Assistant:

static inline void* Memalign(size_t align, size_t size) {
  return noopt(memalign(align, noopt(size)));
}